

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O1

void __thiscall sf::Shader::setUniform(Shader *this,string *name,Texture *texture)

{
  _Rb_tree_header *p_Var1;
  size_t sVar2;
  int iVar3;
  _Base_ptr *pp_Var4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  ulong uVar8;
  TransientContextLock lock;
  int location;
  GLint maxUnits;
  TransientContextLock local_39;
  int local_38;
  GLint local_34;
  Lock local_30;
  
  if (this->m_shaderProgram == 0) {
    return;
  }
  GlResource::TransientContextLock::TransientContextLock(&local_39);
  local_38 = getUniformLocation(this,name);
  if (local_38 != -1) {
    p_Var1 = &(this->m_textures)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = (this->m_textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var7 = &p_Var1->_M_header;
    for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < local_38]
        ) {
      if (local_38 <= (int)p_Var6[1]._M_color) {
        p_Var7 = p_Var6;
      }
    }
    p_Var6 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
       (p_Var6 = p_Var7, local_38 < (int)p_Var7[1]._M_color)) {
      p_Var6 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var6 == p_Var1) {
      sVar2 = (this->m_textures)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      Lock::Lock(&local_30,(Mutex *)&(anonymous_namespace)::maxTextureUnitsMutex);
      if (((anonymous_namespace)::getMaxTextureUnits()::maxUnits == '\0') &&
         (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::getMaxTextureUnits()::maxUnits),
         iVar3 != 0)) {
        local_34 = 0;
        (*sf_glad_glGetIntegerv)(0x8b4d,&local_34);
        (anonymous_namespace)::getMaxTextureUnits()::maxUnits = local_34;
        __cxa_guard_release(&(anonymous_namespace)::getMaxTextureUnits()::maxUnits);
      }
      uVar8 = (ulong)(anonymous_namespace)::getMaxTextureUnits()::maxUnits;
      Lock::~Lock(&local_30);
      if (uVar8 <= sVar2 + 1) {
        poVar5 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"Impossible to use texture \"",0x1b);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(name->_M_dataplus)._M_p,name->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"\" for shader: all available texture units are used",0x32);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        goto LAB_0016db0d;
      }
      pp_Var4 = (_Base_ptr *)
                std::
                map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
                ::operator[](&this->m_textures,&local_38);
    }
    else {
      pp_Var4 = &p_Var6[1]._M_parent;
    }
    *pp_Var4 = (_Base_ptr)texture;
  }
LAB_0016db0d:
  GlResource::TransientContextLock::~TransientContextLock(&local_39);
  return;
}

Assistant:

void Shader::setUniform(const std::string& name, const Texture& texture)
{
    if (m_shaderProgram)
    {
        TransientContextLock lock;

        // Find the location of the variable in the shader
        int location = getUniformLocation(name);
        if (location != -1)
        {
            // Store the location -> texture mapping
            TextureTable::iterator it = m_textures.find(location);
            if (it == m_textures.end())
            {
                // New entry, make sure there are enough texture units
                if (m_textures.size() + 1 >= getMaxTextureUnits())
                {
                    err() << "Impossible to use texture \"" << name << "\" for shader: all available texture units are used" << std::endl;
                    return;
                }

                m_textures[location] = &texture;
            }
            else
            {
                // Location already used, just replace the texture
                it->second = &texture;
            }
        }
    }
}